

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O3

void __thiscall
CrailDirectory::CrailDirectory
          (CrailDirectory *this,FileInfo *file_info,shared_ptr<NamenodeClient> *namenode_client,
          shared_ptr<StorageCache> *storage_cache,shared_ptr<BlockCache> *block_cache)

{
  shared_ptr<BlockCache> local_80;
  shared_ptr<StorageCache> local_70;
  shared_ptr<NamenodeClient> local_60;
  FileInfo local_50;
  
  local_50._vptr_FileInfo = (_func_int **)&PTR__FileInfo_001319d0;
  local_50.fd_ = file_info->fd_;
  local_50.capacity_ = file_info->capacity_;
  local_50.node_type_ = file_info->node_type_;
  local_50._28_4_ = *(undefined4 *)&file_info->field_0x1c;
  local_50.dir_offset_ = file_info->dir_offset_;
  local_50.token_ = file_info->token_;
  local_50.modification_time_ = file_info->modification_time_;
  local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (namenode_client->super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (namenode_client->super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
       ._M_pi;
  if (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (storage_cache->super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (storage_cache->super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (block_cache->super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (block_cache->super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CrailNode::CrailNode(&this->super_CrailNode,&local_50,&local_60,&local_70,&local_80);
  if (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_CrailNode)._vptr_CrailNode = (_func_int **)&PTR__CrailDirectory_00130448;
  return;
}

Assistant:

CrailDirectory::CrailDirectory(FileInfo file_info,
                               shared_ptr<NamenodeClient> namenode_client,
                               shared_ptr<StorageCache> storage_cache,
                               shared_ptr<BlockCache> block_cache)
    : CrailNode(file_info, namenode_client, storage_cache, block_cache) {}